

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_do_button(nk_flags *state,nk_command_buffer *out,nk_rect r,nk_style_button *style,
                nk_input *in,nk_button_behavior behavior,nk_rect *content)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  nk_rect r_00;
  
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x31f6,
                  "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
                 );
  }
  if (state != (nk_flags *)0x0) {
    if (out != (nk_command_buffer *)0x0) {
      fVar1 = (style->padding).x;
      fVar2 = style->border;
      fVar3 = style->rounding;
      content->x = r.x + fVar1 + fVar2 + fVar3;
      fVar4 = (style->padding).y;
      content->y = r.y + fVar4 + fVar2 + fVar3;
      content->w = r.w - (fVar1 + fVar1 + fVar2 + fVar3 + fVar3);
      content->h = r.h - (fVar4 + fVar4 + fVar2 + fVar3 + fVar3);
      fVar1 = (style->touch_padding).x;
      fVar2 = (style->touch_padding).y;
      r_00.x = r.x - fVar1;
      r_00.y = r.y - fVar2;
      r_00.h = fVar2 + fVar2 + r.h;
      r_00.w = fVar1 + fVar1 + r.w;
      iVar5 = nk_button_behavior(state,r_00,in,behavior);
      return iVar5;
    }
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x31f8,
                  "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
                 );
  }
  __assert_fail("state",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x31f7,
                "int nk_do_button(nk_flags *, struct nk_command_buffer *, struct nk_rect, const struct nk_style_button *, const struct nk_input *, enum nk_button_behavior, struct nk_rect *)"
               );
}

Assistant:

NK_INTERN int
nk_do_button(nk_flags *state, struct nk_command_buffer *out, struct nk_rect r,
    const struct nk_style_button *style, const struct nk_input *in,
    enum nk_button_behavior behavior, struct nk_rect *content)
{
    struct nk_rect bounds;
    NK_ASSERT(style);
    NK_ASSERT(state);
    NK_ASSERT(out);
    if (!out || !style)
        return nk_false;

    /* calculate button content space */
    content->x = r.x + style->padding.x + style->border + style->rounding;
    content->y = r.y + style->padding.y + style->border + style->rounding;
    content->w = r.w - (2 * style->padding.x + style->border + style->rounding*2);
    content->h = r.h - (2 * style->padding.y + style->border + style->rounding*2);

    /* execute button behavior */
    bounds.x = r.x - style->touch_padding.x;
    bounds.y = r.y - style->touch_padding.y;
    bounds.w = r.w + 2 * style->touch_padding.x;
    bounds.h = r.h + 2 * style->touch_padding.y;
    return nk_button_behavior(state, bounds, in, behavior);
}